

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O3

void tcu::opt::parseIntList(char *src,vector<int,_std::allocator<int>_> *dst)

{
  iterator __position;
  istream *piVar1;
  int intVal;
  string val;
  istringstream str;
  int local_1cc;
  char *local_1c8;
  undefined8 local_1c0;
  char local_1b8;
  undefined7 uStack_1b7;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,src,(allocator<char> *)&local_1cc);
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)&local_1c8,_S_in);
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  local_1c0 = 0;
  local_1b8 = '\0';
  local_1c8 = &local_1b8;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    local_1cc = 0;
    de::cmdline::parseType<int>(local_1c8,&local_1cc);
    __position._M_current =
         (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (__position._M_current ==
        (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)dst,__position,&local_1cc);
    }
    else {
      *__position._M_current = local_1cc;
      (dst->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
           = __position._M_current + 1;
    }
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

static void parseIntList (const char* src, std::vector<int>* dst)
{
	std::istringstream	str	(src);
	std::string			val;

	while (std::getline(str, val, ','))
	{
		int intVal = 0;
		de::cmdline::parseType(val.c_str(), &intVal);
		dst->push_back(intVal);
	}
}